

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O0

void __thiscall webrtc::EchoCancellationImpl::AllocateRenderQueue(EchoCancellationImpl *this)

{
  size_type __n;
  size_t sVar1;
  unsigned_long *puVar2;
  SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>
  *this_00;
  pointer this_01;
  RenderQueueItemVerifier<float> local_70;
  allocator<float> local_61;
  undefined1 local_60 [8];
  vector<float,_std::allocator<float>_> template_queue_element;
  CritScope local_38;
  CritScope cs_capture;
  CritScope cs_render;
  unsigned_long local_20;
  unsigned_long local_18;
  size_t new_render_queue_element_max_size;
  EchoCancellationImpl *this_local;
  
  local_20 = 1;
  new_render_queue_element_max_size = (size_t)this;
  sVar1 = NumCancellersRequired(this);
  cs_render.cs_ = (CriticalSection *)(sVar1 * 0xa0);
  puVar2 = std::max<unsigned_long>(&local_20,(unsigned_long *)&cs_render);
  local_18 = *puVar2;
  rtc::CritScope::CritScope(&cs_capture,this->crit_render_);
  rtc::CritScope::CritScope(&local_38,this->crit_capture_);
  if (this->render_queue_element_max_size_ < local_18) {
    this->render_queue_element_max_size_ = local_18;
    __n = this->render_queue_element_max_size_;
    std::allocator<float>::allocator(&local_61);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_60,__n,&local_61);
    std::allocator<float>::~allocator(&local_61);
    this_00 = (SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>
               *)operator_new(0x70);
    RenderQueueItemVerifier<float>::RenderQueueItemVerifier
              (&local_70,this->render_queue_element_max_size_);
    SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>::
    SwapQueue(this_00,100,(vector<float,_std::allocator<float>_> *)local_60,&local_70);
    std::
    unique_ptr<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
    ::reset(&this->render_signal_queue_,this_00);
    std::vector<float,_std::allocator<float>_>::resize
              (&this->render_queue_buffer_,this->render_queue_element_max_size_);
    std::vector<float,_std::allocator<float>_>::resize
              (&this->capture_queue_buffer_,this->render_queue_element_max_size_);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_60);
  }
  else {
    this_01 = std::
              unique_ptr<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
              ::operator->(&this->render_signal_queue_);
    SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>::
    Clear(this_01);
  }
  rtc::CritScope::~CritScope(&local_38);
  rtc::CritScope::~CritScope(&cs_capture);
  return;
}

Assistant:

void EchoCancellationImpl::AllocateRenderQueue() {
  const size_t new_render_queue_element_max_size = std::max<size_t>(
      static_cast<size_t>(1),
      kMaxAllowedValuesOfSamplesPerFrame * NumCancellersRequired());

  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);

  // Reallocate the queue if the queue item size is too small to fit the
  // data to put in the queue.
  if (render_queue_element_max_size_ < new_render_queue_element_max_size) {
    render_queue_element_max_size_ = new_render_queue_element_max_size;

    std::vector<float> template_queue_element(render_queue_element_max_size_);

    render_signal_queue_.reset(
        new SwapQueue<std::vector<float>, RenderQueueItemVerifier<float>>(
            kMaxNumFramesToBuffer, template_queue_element,
            RenderQueueItemVerifier<float>(render_queue_element_max_size_)));

    render_queue_buffer_.resize(render_queue_element_max_size_);
    capture_queue_buffer_.resize(render_queue_element_max_size_);
  } else {
    render_signal_queue_->Clear();
  }
}